

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void cfl_store_inter_block(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  MB_MODE_INFO *pMVar1;
  
  if ((cm->seq_params->monochrome == '\0') &&
     ((pMVar1 = *xd->mi, xd->is_chroma_ref != true ||
      ((((pMVar1->field_0xa7 & 0x80) == 0 && (pMVar1->ref_frame[0] < '\x01')) &&
       (pMVar1->uv_mode == '\r')))))) {
    cfl_store_block(xd,pMVar1->bsize,pMVar1->tx_size);
    return;
  }
  return;
}

Assistant:

static inline void cfl_store_inter_block(AV1_COMMON *const cm,
                                         MACROBLOCKD *const xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  if (store_cfl_required(cm, xd)) {
    cfl_store_block(xd, mbmi->bsize, mbmi->tx_size);
  }
}